

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O3

void do_redit(CHAR_DATA *ch,char *argument)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ROOM_INDEX_DATA *pRoomIndex;
  char *pcVar5;
  ROOM_INDEX_DATA *pRoom;
  char arg1 [4608];
  char acStack_1228 [4616];
  
  bVar2 = check_security(ch);
  if (!bVar2) {
    return;
  }
  pcVar4 = one_argument(argument,acStack_1228);
  pRoom = ch->in_room;
  bVar2 = check_security(ch);
  if (!bVar2) {
    return;
  }
  bVar2 = str_cmp(acStack_1228,"reset");
  if (bVar2) {
    bVar2 = str_cmp(acStack_1228,"create");
    if (bVar2) {
      atoi(acStack_1228);
      pRoomIndex = get_room_index(0);
      if ((pRoomIndex == (ROOM_INDEX_DATA *)0x0) || (bVar2 = is_switched(ch), bVar2)) {
LAB_00354915:
        iVar3 = atoi(acStack_1228);
        if (iVar3 != 0) {
          pcVar4 = "Insufficient security to modify room, or room does not exist.\n\r";
          goto LAB_00354a71;
        }
      }
      else {
        if (ch->pcdata->security <= pRoomIndex->area->security) {
          pcVar4 = pRoomIndex->area->builders;
          pcVar5 = strstr(pcVar4,ch->name);
          if ((pcVar5 == (char *)0x0) && (pcVar4 = strstr(pcVar4,"All"), pcVar4 == (char *)0x0))
          goto LAB_00354915;
        }
        char_from_room(ch);
        char_to_room(ch,pRoomIndex);
LAB_00354a57:
        pRoom = ch->in_room;
      }
    }
    else {
      if ((*pcVar4 == '\0') || (iVar3 = atoi(pcVar4), iVar3 == 0)) {
        pcVar4 = "Syntax:  edit room create [vnum]\n\r";
        goto LAB_00354a71;
      }
      bVar2 = redit_create(ch,pcVar4);
      if (bVar2) {
        char_from_room(ch);
        char_to_room(ch,(ROOM_INDEX_DATA *)ch->desc->pEdit);
        plVar1 = pRoom->area->area_flags;
        *plVar1 = *plVar1 | 8;
        goto LAB_00354a57;
      }
    }
    bVar2 = is_switched(ch);
    if (!bVar2) {
      if (pRoom->area->security < ch->pcdata->security) {
LAB_00354ad0:
        ch->desc->editor = 2;
        redit_show(ch,"");
        return;
      }
      pcVar4 = pRoom->area->builders;
      pcVar5 = strstr(pcVar4,ch->name);
      if ((pcVar5 != (char *)0x0) || (pcVar4 = strstr(pcVar4,"All"), pcVar4 != (char *)0x0))
      goto LAB_00354ad0;
    }
  }
  else {
    bVar2 = is_switched(ch);
    if (!bVar2) {
      if (ch->pcdata->security <= pRoom->area->security) {
        pcVar4 = pRoom->area->builders;
        pcVar5 = strstr(pcVar4,ch->name);
        if ((pcVar5 == (char *)0x0) && (pcVar4 = strstr(pcVar4,"All"), pcVar4 == (char *)0x0))
        goto LAB_00354a6a;
      }
      reset_room(pRoom);
      pcVar4 = "Room reset.\n\r";
      goto LAB_00354a71;
    }
  }
LAB_00354a6a:
  pcVar4 = "Insufficient security to modify area.\n\r";
LAB_00354a71:
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_redit(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoom, *pRoom2;
	char arg1[MAX_STRING_LENGTH];

	if (!check_security(ch))
		return;

	argument = one_argument(argument, arg1);

	pRoom = ch->in_room;

	if (!check_security(ch))
		return;

	if (!str_cmp(arg1, "reset"))
	{
		if (!IS_BUILDER(ch, pRoom->area))
		{
			send_to_char("Insufficient security to modify area.\n\r", ch);
			return;
		}

		reset_room(pRoom);
		send_to_char("Room reset.\n\r", ch);
		return;
	}
	else if (!str_cmp(arg1, "create"))
	{
		if (argument[0] == '\0' || atoi(argument) == 0)
		{
			send_to_char("Syntax:  edit room create [vnum]\n\r", ch);
			return;
		}

		if (redit_create(ch, argument))
		{
			char_from_room(ch);
			char_to_room(ch, (ROOM_INDEX_DATA *)ch->desc->pEdit);
			SET_BIT(pRoom->area->area_flags, AREA_CHANGED);
			pRoom = ch->in_room;
		}
	}
	else
	{
		pRoom2 = get_room_index(atoi(arg1));

		if (pRoom2 != nullptr && IS_BUILDER(ch, pRoom2->area))
		{
			char_from_room(ch);
			char_to_room(ch, pRoom2);
			pRoom = ch->in_room;
		}
		else if (atoi(arg1) != 0)
		{
			send_to_char("Insufficient security to modify room, or room does not exist.\n\r", ch);
			return;
		}
	}

	if (!IS_BUILDER(ch, pRoom->area))
	{
		send_to_char("Insufficient security to modify area.\n\r", ch);
		return;
	}

	ch->desc->editor = ED_ROOM;
	redit_show(ch, "");
}